

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMutexTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupSimpleMutexTest::setup(TEST_GROUP_CppUTestGroupSimpleMutexTest *this)

{
  CppUTestStore(&PlatformSpecificMutexCreate);
  PlatformSpecificMutexCreate = StubMutexCreate;
  CppUTestStore(&PlatformSpecificMutexLock);
  PlatformSpecificMutexLock = StubMutexLock;
  CppUTestStore(&PlatformSpecificMutexUnlock);
  PlatformSpecificMutexUnlock = StubMutexUnlock;
  CppUTestStore(&PlatformSpecificMutexDestroy);
  PlatformSpecificMutexDestroy = StubMutexDestroy;
  mutexCreateCount = 0;
  mutexDestroyCount = 0;
  mutexLockCount = 0;
  mutexUnlockCount = 0;
  return;
}

Assistant:

void setup() _override
    {
        UT_PTR_SET(PlatformSpecificMutexCreate, StubMutexCreate);
        UT_PTR_SET(PlatformSpecificMutexLock, StubMutexLock);
        UT_PTR_SET(PlatformSpecificMutexUnlock, StubMutexUnlock);
        UT_PTR_SET(PlatformSpecificMutexDestroy, StubMutexDestroy);

        mutexCreateCount = 0;
        mutexDestroyCount = 0;
        mutexLockCount = 0;
        mutexUnlockCount = 0;
    }